

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JP2K.cpp
# Opt level: O0

char * ASDCP::JP2K::GetMarkerString(Marker_t m)

{
  char *pcStack_10;
  Marker_t m_local;
  
  if (m == MRK_NIL) {
    pcStack_10 = "NIL";
  }
  else if (m == MRK_SOC) {
    pcStack_10 = "SOC: Start of codestream";
  }
  else if (m == MRK_CAP) {
    pcStack_10 = "CAP: Capabilities";
  }
  else if (m == MRK_SIZ) {
    pcStack_10 = "SIZ: Image and tile size";
  }
  else if (m == MRK_COD) {
    pcStack_10 = "COD: Coding style default";
  }
  else if (m == MRK_COC) {
    pcStack_10 = "COC: Coding style component";
  }
  else if (m == MRK_TLM) {
    pcStack_10 = "TLM: Tile-part lengths";
  }
  else if (m == MRK_PRF) {
    pcStack_10 = "PRF: Profile";
  }
  else if (m == MRK_PLM) {
    pcStack_10 = "PLM: Packet length, main header";
  }
  else if (m == MRK_PLT) {
    pcStack_10 = "PLT: Packet length, tile-part header";
  }
  else if (m == MRK_CPF) {
    pcStack_10 = "CPF: Corresponding profile";
  }
  else if (m == MRK_QCD) {
    pcStack_10 = "QCD: Quantization default";
  }
  else if (m == MRK_QCC) {
    pcStack_10 = "QCC: Quantization component";
  }
  else if (m == MRK_RGN) {
    pcStack_10 = "RGN: Region of interest";
  }
  else if (m == MRK_POC) {
    pcStack_10 = "POC: Progression order change";
  }
  else if (m == MRK_PPM) {
    pcStack_10 = "PPM: Packed packet headers, main header";
  }
  else if (m == MRK_PPT) {
    pcStack_10 = "PPT: Packed packet headers, tile-part header";
  }
  else if (m == MRK_CRG) {
    pcStack_10 = "CRG: Component registration";
  }
  else if (m == MRK_COM) {
    pcStack_10 = "COM: Comment";
  }
  else if (m == MRK_SOT) {
    pcStack_10 = "SOT: Start of tile-part";
  }
  else if (m == MRK_SOP) {
    pcStack_10 = "SOP: Start of packet";
  }
  else if (m == MRK_EPH) {
    pcStack_10 = "EPH: End of packet header";
  }
  else if (m == MRK_SOD) {
    pcStack_10 = "SOD: Start of data";
  }
  else if (m == MRK_EOC) {
    pcStack_10 = "EOC: End of codestream";
  }
  else {
    pcStack_10 = "Unknown marker code";
  }
  return pcStack_10;
}

Assistant:

const char*
ASDCP::JP2K::GetMarkerString(Marker_t m)
{
  switch ( m )
    {
    case MRK_NIL: return "NIL"; break;
    case MRK_SOC: return "SOC: Start of codestream"; break;
    case MRK_SOT: return "SOT: Start of tile-part"; break;
    case MRK_SOD: return "SOD: Start of data"; break;
    case MRK_EOC: return "EOC: End of codestream"; break;
    case MRK_SIZ: return "SIZ: Image and tile size"; break;
    case MRK_COD: return "COD: Coding style default"; break;
    case MRK_COC: return "COC: Coding style component"; break;
    case MRK_RGN: return "RGN: Region of interest"; break;
    case MRK_QCD: return "QCD: Quantization default"; break;
    case MRK_QCC: return "QCC: Quantization component"; break;
    case MRK_POC: return "POC: Progression order change"; break;
    case MRK_TLM: return "TLM: Tile-part lengths"; break;
    case MRK_PLM: return "PLM: Packet length, main header"; break;
    case MRK_PLT: return "PLT: Packet length, tile-part header"; break;
    case MRK_PPM: return "PPM: Packed packet headers, main header"; break;
    case MRK_PPT: return "PPT: Packed packet headers, tile-part header"; break;
    case MRK_SOP: return "SOP: Start of packet"; break;
    case MRK_EPH: return "EPH: End of packet header"; break;
    case MRK_CRG: return "CRG: Component registration"; break;
    case MRK_COM: return "COM: Comment"; break;
    case MRK_CPF: return "CPF: Corresponding profile"; break;
    case MRK_CAP: return "CAP: Capabilities"; break;
    case MRK_PRF: return "PRF: Profile"; break;
    }

  return "Unknown marker code";
}